

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void pbrt::CPURender(ParsedScene *parsedScene)

{
  SceneEntity *name;
  _Rb_tree_node_base *__k;
  ParameterDictionary *this;
  FileLoc *loc;
  CameraTransform *cameraTransform;
  FileLoc *loc_00;
  SceneEntity *name_00;
  pointer pSVar1;
  pointer ppVar2;
  pointer pLVar3;
  pointer pIVar4;
  undefined8 uVar5;
  Transform *pTVar6;
  RGBColorSpace *colorSpace;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
  *pmVar7;
  ParsedScene *pPVar8;
  pointer pPVar9;
  pointer pPVar10;
  bool bVar11;
  bool bVar12;
  Allocator alloc_00;
  iterator iVar13;
  BVHAggregate *this_00;
  mapped_type *pmVar14;
  _Rb_tree_node_base *p_Var15;
  undefined8 *puVar16;
  AnimatedPrimitive *this_01;
  _Base_ptr p_Var17;
  SceneEntity *mtl;
  pointer __lhs;
  pointer name_01;
  pointer __k_00;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  TVar18;
  byte bVar19;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
  *namedMtl;
  pointer ppVar20;
  long in_FS_OFFSET;
  Float FVar21;
  Float FVar22;
  bool haveScatteringMedia;
  ParsedScene *local_330;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> instancePrimitives;
  Allocator alloc;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> primitives;
  CameraHandle camera;
  anon_class_16_2_f001ee1d findMedium;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights;
  PrimitiveHandle local_2a0;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_298;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_290;
  PrimitiveHandle local_288;
  PrimitiveHandle bvh;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> movingInstancePrimitives;
  MediumHandle local_260;
  SamplerHandle sampler;
  MediumHandle cameraMedium;
  FilmHandle film;
  FilterHandle filter;
  vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_> materials;
  _Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> local_218;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> animatedPrimitives;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
  instanceDefinitions;
  anon_class_56_7_455aa864 CreatePrimitivesForShapes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  floatTextures;
  _Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_150;
  _Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> local_138;
  anon_class_56_7_455aa864 CreatePrimitivesForAnimatedShapes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  spectrumTextures;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> local_b8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_b0;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
  namedMaterials;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
  media;
  anon_class_16_2_c82bbf6a getAlphaTexture;
  
  alloc_00.memoryResource = pstd::pmr::new_delete_resource();
  alloc.memoryResource = alloc_00.memoryResource;
  ParsedScene::CreateMedia_abi_cxx11_(&media,parsedScene,alloc_00);
  findMedium.haveScatteringMedia = &haveScatteringMedia;
  haveScatteringMedia = false;
  local_330 = parsedScene;
  findMedium.media = &media;
  FilterHandle::Create
            (&filter,&(parsedScene->filter).name,&(parsedScene->filter).parameters,
             &(parsedScene->filter).loc,alloc_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&CreatePrimitivesForShapes,"shutterclose",(allocator<char> *)&floatTextures);
  this = &(local_330->camera).super_SceneEntity.parameters;
  FVar21 = ParameterDictionary::GetOneFloat(this,(string *)&CreatePrimitivesForShapes,1.0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&CreatePrimitivesForAnimatedShapes,"shutteropen",
             (allocator<char> *)&spectrumTextures);
  FVar22 = ParameterDictionary::GetOneFloat(this,(string *)&CreatePrimitivesForAnimatedShapes,0.0);
  std::__cxx11::string::~string((string *)&CreatePrimitivesForAnimatedShapes);
  std::__cxx11::string::~string((string *)&CreatePrimitivesForShapes);
  pPVar8 = local_330;
  if (FVar21 - FVar22 <= 0.0) {
    ErrorExit(&(local_330->camera).super_SceneEntity.loc,
              "The specified camera shutter times imply that the shutter does not open.  A black image will result."
             );
  }
  name = &local_330->film;
  loc = &(local_330->film).loc;
  local_a8 = filter.
             super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
             .bits;
  FilmHandle::Create(&film,&name->name,&(local_330->film).parameters,FVar21 - FVar22,
                     (FilterHandle *)&local_a8,loc,alloc);
  CPURender::anon_class_16_2_f001ee1d::operator()
            ((anon_class_16_2_f001ee1d *)&cameraMedium,(string *)&findMedium,
             (FileLoc *)&(pPVar8->camera).medium);
  cameraTransform = &(pPVar8->camera).cameraTransform;
  local_b0 = cameraMedium.
             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             .bits;
  local_b8 = film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  CameraHandle::Create
            (&camera,(string *)&pPVar8->camera,this,(MediumHandle *)&local_b0,cameraTransform,
             (FilmHandle *)&local_b8,&(pPVar8->camera).super_SceneEntity.loc,alloc);
  CreatePrimitivesForShapes.alloc =
       *(Allocator **)
        (*(ulong *)(((ulong)camera.
                            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                            .bits & 0xffffffffffff) + 0x340) & 0xffffffffffff);
  SamplerHandle::Create
            (&sampler,&(pPVar8->sampler).name,&(pPVar8->sampler).parameters,
             (Point2i *)&CreatePrimitivesForShapes,&(pPVar8->sampler).loc,alloc);
  floatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &floatTextures._M_t._M_impl.super__Rb_tree_header._M_header;
  spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header;
  floatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  floatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  floatTextures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  floatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       floatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ParsedScene::CreateTextures(pPVar8,&floatTextures,&spectrumTextures,alloc,false);
  namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header;
  namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  namedMaterials._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  materials.super__Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ParsedScene::CreateMaterials
            (pPVar8,&floatTextures,&spectrumTextures,alloc,&namedMaterials,&materials);
  pSVar1 = (pPVar8->materials).
           super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar19 = 0;
  for (__lhs = (pPVar8->materials).
               super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
               super__Vector_impl_data._M_start; __lhs != pSVar1; __lhs = __lhs + 1) {
    bVar11 = std::operator==(&__lhs->name,"subsurface");
    bVar19 = bVar19 | bVar11;
  }
  ppVar2 = (local_330->namedMaterials).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar20 = (local_330->namedMaterials).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pPVar8 = local_330, ppVar20 != ppVar2;
      ppVar20 = ppVar20 + 1) {
    bVar11 = std::operator==(&(ppVar20->second).name,"subsurface");
    bVar19 = bVar19 | bVar11;
  }
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::reserve
            (&lights,((long)(local_330->lights).
                            super__Vector_base<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_330->lights).
                           super__Vector_base<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x378 +
                     ((long)(local_330->areaLights).
                            super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_330->areaLights).
                           super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xa0);
  pLVar3 = (pPVar8->lights).
           super__Vector_base<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (name_01 = (pPVar8->lights).
                 super__Vector_base<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>
                 ._M_impl.super__Vector_impl_data._M_start; pPVar8 = local_330, name_01 != pLVar3;
      name_01 = name_01 + 1) {
    loc_00 = &(name_01->super_TransformedSceneEntity).super_SceneEntity.loc;
    CPURender::anon_class_16_2_f001ee1d::operator()
              ((anon_class_16_2_f001ee1d *)&CreatePrimitivesForShapes,(string *)&findMedium,
               (FileLoc *)&name_01->medium);
    if ((name_01->super_TransformedSceneEntity).renderFromObject.actuallyAnimated == true) {
      Warning(loc_00,"Animated lights aren\'t supported. Using the start transform.");
    }
    local_260.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )CreatePrimitivesForShapes.alloc;
    LightHandle::Create((LightHandle *)&CreatePrimitivesForAnimatedShapes,(string *)name_01,
                        &(name_01->super_TransformedSceneEntity).super_SceneEntity.parameters,
                        &(name_01->super_TransformedSceneEntity).renderFromObject.startTransform,
                        cameraTransform,&local_260,loc_00,alloc);
    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::push_back
              (&lights,(value_type *)&CreatePrimitivesForAnimatedShapes);
  }
  CreatePrimitivesForShapes.materials = &materials;
  getAlphaTexture.floatTextures = &floatTextures;
  CreatePrimitivesForShapes.parsedScene = local_330;
  CreatePrimitivesForShapes.alloc = &alloc;
  CreatePrimitivesForShapes.getAlphaTexture = &getAlphaTexture;
  CreatePrimitivesForShapes.namedMaterials = &namedMaterials;
  CreatePrimitivesForShapes.findMedium = &findMedium;
  CreatePrimitivesForShapes.lights = &lights;
  getAlphaTexture.alloc = &alloc;
  CPURender::anon_class_56_7_455aa864::operator()
            (&primitives,&CreatePrimitivesForShapes,&local_330->shapes);
  CreatePrimitivesForAnimatedShapes.materials = &materials;
  CreatePrimitivesForAnimatedShapes.parsedScene = pPVar8;
  CreatePrimitivesForAnimatedShapes.alloc = &alloc;
  CreatePrimitivesForAnimatedShapes.getAlphaTexture = &getAlphaTexture;
  CreatePrimitivesForAnimatedShapes.namedMaterials = &namedMaterials;
  CreatePrimitivesForAnimatedShapes.findMedium = &findMedium;
  CreatePrimitivesForAnimatedShapes.lights = &lights;
  CPURender::anon_class_56_7_455aa864::operator()
            (&animatedPrimitives,&CreatePrimitivesForAnimatedShapes,&pPVar8->animatedShapes);
  std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>::
  insert<__gnu_cxx::__normal_iterator<pbrt::PrimitiveHandle*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>>,void>
            ((vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>> *)&primitives,
             (const_iterator)
             primitives.
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
              )animatedPrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
              )animatedPrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header;
  instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var15 = (local_330->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar7 = &local_330->instanceDefinitions;
  instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var15 == &(pmVar7->_M_t)._M_impl.super__Rb_tree_header) {
      __k_00 = (local_330->instances).
               super__Vector_base<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar4 = (local_330->instances).
               super__Vector_base<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        pPVar9 = primitives.
                 super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (__k_00 == pIVar4) {
          if (primitives.
              super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              primitives.
              super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            TVar18.bits = 0;
          }
          else {
            local_138._M_impl.super__Vector_impl_data._M_start =
                 primitives.
                 super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            local_138._M_impl.super__Vector_impl_data._M_finish =
                 primitives.
                 super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            primitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            primitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            primitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_138._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar9;
            CreateAccelerator((pbrt *)&instancePrimitives,&(local_330->accelerator).name,
                              (vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                               *)&local_138,&(local_330->accelerator).parameters);
            TVar18.bits = (uintptr_t)
                          instancePrimitives.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            std::_Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::
            ~_Vector_base(&local_138);
          }
          pPVar8 = local_330;
          colorSpace = (local_330->film).parameters.colorSpace;
          local_290 = camera.
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      .bits;
          local_298 = sampler.
                      super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      .bits;
          local_2a0.
          super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
          .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                   )(TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                     )TVar18.bits;
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                    ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_150,
                     &lights);
          name_00 = &pPVar8->integrator;
          Integrator::Create((Integrator *)&instancePrimitives,&name_00->name,
                             &(pPVar8->integrator).parameters,(CameraHandle *)&local_290,
                             (SamplerHandle *)&local_298,&local_2a0,
                             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             &local_150,colorSpace,&(pPVar8->integrator).loc);
          std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base
                    (&local_150);
          if (haveScatteringMedia == true) {
            bVar11 = std::operator!=(&name_00->name,"volpath");
            if (bVar11) {
              bVar11 = std::operator!=(&name_00->name,"simplevolpath");
              if (bVar11) {
                bVar11 = std::operator!=(&name_00->name,"bdpt");
                if (bVar11) {
                  bVar11 = std::operator!=(&name_00->name,"mlt");
                  if (bVar11) {
                    Warning<std::__cxx11::string&>
                              ("Scene has scattering media but \"%s\" integrator doesn\'t support volume scattering. Consider using \"volpath\", \"simplevolpath\", \"bdpt\", or \"mlt\"."
                               ,&name_00->name);
                  }
                }
              }
            }
          }
          bVar11 = lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                   _M_impl.super__Vector_impl_data._M_start !=
                   lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (p_Var17 = media._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var17 != &media._M_t._M_impl.super__Rb_tree_header;
              p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
            bVar12 = MediumHandle::IsEmissive((MediumHandle *)(p_Var17 + 2));
            bVar11 = (bool)(bVar11 | bVar12);
          }
          if (bVar11 == false) {
            bVar11 = std::operator!=(&name_00->name,"ambientocclusion");
            if (bVar11) {
              bVar11 = std::operator!=(&name_00->name,"aov");
              if (bVar11) {
                Warning<>("No light sources defined in scene; rendering a black image.");
              }
            }
          }
          bVar11 = std::operator==(&name->name,"gbuffer");
          if (bVar11) {
            bVar11 = std::operator!=(&name_00->name,"path");
            if (bVar11) {
              Warning<std::__cxx11::string&>
                        (loc,
                         "GBufferFilm is not supported by %s. The channels other than R, G, B will be zero."
                         ,&name_00->name);
            }
          }
          if (bVar19 != 0) {
            bVar11 = std::operator!=(&name_00->name,"volpath");
            if (bVar11) {
              Warning<std::__cxx11::string&>
                        ("Some objects in the scene have subsurface scattering, which is not supported by the %s integrator. Use the \"volpath\" integrator to render them correctly."
                         ,&name_00->name);
            }
          }
          if (LOGGING_LogLevel < 1) {
            movingInstancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)GetCurrentRSS();
            Log<unsigned_long>(Verbose,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/render.cpp"
                               ,0x152,"Memory used after scene creation: %d",
                               (unsigned_long *)&movingInstancePrimitives);
          }
          (**(code **)(((instancePrimitives.
                         super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                       ).bits + 0x18))();
          if (LOGGING_LogLevel < 1) {
            movingInstancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)GetCurrentRSS();
            Log<unsigned_long>(Verbose,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/render.cpp"
                               ,0x157,"Memory used after rendering: %s",
                               (unsigned_long *)&movingInstancePrimitives);
          }
          PtexTextureBase::ReportStats();
          ImageTextureBase::ClearCache();
          FreeBufferCaches();
          if (instancePrimitives.
              super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(((instancePrimitives.
                           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                         ).bits + 8))();
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
          ::~_Rb_tree(&instanceDefinitions._M_t);
          std::_Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::
          ~_Vector_base(&animatedPrimitives.
                         super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                       );
          std::_Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::
          ~_Vector_base(&primitives.
                         super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                       );
          std::_Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~_Vector_base
                    (&lights.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>);
          std::_Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>::
          ~_Vector_base(&materials.
                         super__Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>
                       );
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
          ::~_Rb_tree(&namedMaterials._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
          ::~_Rb_tree(&spectrumTextures._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
          ::~_Rb_tree(&floatTextures._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
          ::~_Rb_tree(&media._M_t);
          return;
        }
        iVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                 ::find(&instanceDefinitions._M_t,(key_type *)__k_00);
        if ((_Rb_tree_header *)iVar13._M_node ==
            &instanceDefinitions._M_t._M_impl.super__Rb_tree_header) break;
        if (*(long *)(iVar13._M_node + 2) != 0) {
          if (__k_00->renderFromInstance == (Transform *)0x0) {
            this_01 = (AnimatedPrimitive *)operator_new(0x2c0);
            local_288.
            super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
            .bits = *(TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                      *)(iVar13._M_node + 2);
            AnimatedPrimitive::AnimatedPrimitive(this_01,&local_288,&__k_00->renderFromInstanceAnim)
            ;
            instancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)((ulong)this_01 | 0x4000000000000);
            std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::
            emplace_back<pbrt::PrimitiveHandle>(&primitives,(PrimitiveHandle *)&instancePrimitives);
          }
          else {
            puVar16 = (undefined8 *)operator_new(0x10);
            uVar5 = *(undefined8 *)(iVar13._M_node + 2);
            pTVar6 = __k_00->renderFromInstance;
            *(long *)(in_FS_OFFSET + -0x5a0) = *(long *)(in_FS_OFFSET + -0x5a0) + 0x10;
            *puVar16 = uVar5;
            puVar16[1] = pTVar6;
            instancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)((ulong)puVar16 | 0x3000000000000);
            std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::
            emplace_back<pbrt::PrimitiveHandle>(&primitives,(PrimitiveHandle *)&instancePrimitives);
          }
        }
        __k_00 = __k_00 + 1;
      }
      ErrorExit<std::__cxx11::string_const&>
                (&(__k_00->super_SceneEntity).loc,"%s: object instance not defined",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k_00);
    }
    __k = p_Var15 + 1;
    iVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
             ::find(&instanceDefinitions._M_t,(key_type *)__k);
    if ((_Rb_tree_header *)iVar13._M_node != &instanceDefinitions._M_t._M_impl.super__Rb_tree_header
       ) break;
    CPURender::anon_class_56_7_455aa864::operator()
              (&instancePrimitives,&CreatePrimitivesForShapes,
               (vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)
               &p_Var15[3]._M_right);
    CPURender::anon_class_56_7_455aa864::operator()
              ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
               &movingInstancePrimitives.
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>,
               &CreatePrimitivesForAnimatedShapes,
               (vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
                *)&p_Var15[4]._M_left);
    std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>::
    insert<__gnu_cxx::__normal_iterator<pbrt::PrimitiveHandle*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>>,void>
              ((vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>> *)
               &instancePrimitives,
               (const_iterator)
               instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
                )movingInstancePrimitives.
                 super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<pbrt::PrimitiveHandle_*,_std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>_>
                )movingInstancePrimitives.
                 super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    pPVar10 = instancePrimitives.
              super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pPVar9 = instancePrimitives.
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_start ==
        instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                ::operator[](&instanceDefinitions,(key_type *)__k);
      (pmVar14->
      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
      ).bits = 0;
    }
    else {
      if (8 < (ulong)((long)instancePrimitives.
                            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)instancePrimitives.
                           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        this_00 = (BVHAggregate *)operator_new(0x30);
        local_218._M_impl.super__Vector_impl_data._M_end_of_storage =
             instancePrimitives.
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_218._M_impl.super__Vector_impl_data._M_start = pPVar9;
        local_218._M_impl.super__Vector_impl_data._M_finish = pPVar10;
        instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        BVHAggregate::BVHAggregate
                  (this_00,(vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)
                           &local_218,1,SAH);
        bvh.
        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
        .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                 )((ulong)this_00 | 0x5000000000000);
        std::_Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::
        ~_Vector_base(&local_218);
        if (instancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            instancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          instancePrimitives.
          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
          super__Vector_impl_data._M_finish =
               instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::push_back
                  (&instancePrimitives,&bvh);
      }
      pPVar9 = instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                ::operator[](&instanceDefinitions,(key_type *)__k);
      (pmVar14->
      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
      ).bits = (pPVar9->
               super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
               ).bits;
    }
    std::_Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~_Vector_base
              (&movingInstancePrimitives.
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>);
    std::_Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::~_Vector_base
              (&instancePrimitives.
                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>);
    p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
  }
  ErrorExit<std::__cxx11::string_const&>
            ("%s: object instance redefined",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
}

Assistant:

void CPURender(ParsedScene &parsedScene) {
    Allocator alloc;

    // Create media first (so have them for the camera...)
    std::map<std::string, MediumHandle> media = parsedScene.CreateMedia(alloc);

    bool haveScatteringMedia = false;
    auto findMedium = [&media, &haveScatteringMedia](const std::string &s,
                                                     const FileLoc *loc) -> MediumHandle {
        if (s.empty())
            return nullptr;

        auto iter = media.find(s);
        if (iter == media.end())
            ErrorExit(loc, "%s: medium not defined", s);
        haveScatteringMedia = true;
        return iter->second;
    };

    // Filter
    FilterHandle filter =
        FilterHandle::Create(parsedScene.filter.name, parsedScene.filter.parameters,
                             &parsedScene.filter.loc, alloc);

    // Film
    // It's a little ugly to poke into the camera's parameters here, but we
    // have this circular dependency that CameraHandle::Create() expects a
    // FilmHandle, yet now the film needs to know the exposure time from
    // the camera....
    Float exposureTime = parsedScene.camera.parameters.GetOneFloat("shutterclose", 1.f) -
                         parsedScene.camera.parameters.GetOneFloat("shutteropen", 0.f);
    if (exposureTime <= 0)
        ErrorExit(&parsedScene.camera.loc,
                  "The specified camera shutter times imply that the shutter "
                  "does not open.  A black image will result.");
    FilmHandle film =
        FilmHandle::Create(parsedScene.film.name, parsedScene.film.parameters,
                           exposureTime, filter, &parsedScene.film.loc, alloc);

    // Camera
    MediumHandle cameraMedium =
        findMedium(parsedScene.camera.medium, &parsedScene.camera.loc);
    CameraHandle camera = CameraHandle::Create(
        parsedScene.camera.name, parsedScene.camera.parameters, cameraMedium,
        parsedScene.camera.cameraTransform, film, &parsedScene.camera.loc, alloc);

    // Create _Sampler_ for rendering
    SamplerHandle sampler = SamplerHandle::Create(
        parsedScene.sampler.name, parsedScene.sampler.parameters,
        camera.GetFilm().FullResolution(), &parsedScene.sampler.loc, alloc);

    // Textures
    std::map<std::string, FloatTextureHandle> floatTextures;
    std::map<std::string, SpectrumTextureHandle> spectrumTextures;
    parsedScene.CreateTextures(&floatTextures, &spectrumTextures, alloc, false);

    // Materials
    std::map<std::string, MaterialHandle> namedMaterials;
    std::vector<MaterialHandle> materials;
    parsedScene.CreateMaterials(floatTextures, spectrumTextures, alloc, &namedMaterials,
                                &materials);
    bool haveSubsurface = false;
    for (const auto &mtl : parsedScene.materials)
        if (mtl.name == "subsurface")
            haveSubsurface = true;
    for (const auto &namedMtl : parsedScene.namedMaterials)
        if (namedMtl.second.name == "subsurface")
            haveSubsurface = true;

    // Lights (area lights will be done later, with shapes...)
    std::vector<LightHandle> lights;
    lights.reserve(parsedScene.lights.size() + parsedScene.areaLights.size());
    for (const auto &light : parsedScene.lights) {
        MediumHandle outsideMedium = findMedium(light.medium, &light.loc);
        if (light.renderFromObject.IsAnimated())
            Warning(&light.loc,
                    "Animated lights aren't supported. Using the start transform.");
        LightHandle l = LightHandle::Create(
            light.name, light.parameters, light.renderFromObject.startTransform,
            parsedScene.camera.cameraTransform, outsideMedium, &light.loc, alloc);
        lights.push_back(l);
    }

    // Primitives
    auto getAlphaTexture = [&](const ParameterDictionary &parameters,
                               const FileLoc *loc) -> FloatTextureHandle {
        std::string alphaTexName = parameters.GetTexture("alpha");
        if (!alphaTexName.empty()) {
            if (floatTextures.find(alphaTexName) != floatTextures.end())
                return floatTextures[alphaTexName];
            else
                ErrorExit(loc, "%s: couldn't find float texture for \"alpha\" parameter.",
                          alphaTexName);
        } else if (parameters.GetOneFloat("alpha", 1.f) == 0.f)
            return alloc.new_object<FloatConstantTexture>(0.f);
        else
            return nullptr;
    };

    // Non-animated shapes
    auto CreatePrimitivesForShapes =
        [&](const std::vector<ShapeSceneEntity> &shapes) -> std::vector<PrimitiveHandle> {
        std::vector<PrimitiveHandle> primitives;
        for (const auto &sh : shapes) {
            pstd::vector<ShapeHandle> shapes =
                ShapeHandle::Create(sh.name, sh.renderFromObject, sh.objectFromRender,
                                    sh.reverseOrientation, sh.parameters, &sh.loc, alloc);
            if (shapes.empty())
                continue;

            FloatTextureHandle alphaTex = getAlphaTexture(sh.parameters, &sh.loc);
            sh.parameters.ReportUnused();  // do now so can grab alpha...

            MaterialHandle mtl = nullptr;
            if (!sh.materialName.empty()) {
                auto iter = namedMaterials.find(sh.materialName);
                if (iter == namedMaterials.end())
                    ErrorExit(&sh.loc, "%s: no named material defined.", sh.materialName);
                mtl = iter->second;
            } else {
                CHECK_LT(sh.materialIndex, materials.size());
                mtl = materials[sh.materialIndex];
            }

            MediumInterface mi(findMedium(sh.insideMedium, &sh.loc),
                               findMedium(sh.outsideMedium, &sh.loc));

            for (auto &s : shapes) {
                // Possibly create area light for shape
                LightHandle areaHandle = nullptr;
                if (sh.lightIndex != -1) {
                    CHECK_LT(sh.lightIndex, parsedScene.areaLights.size());
                    const auto &areaLightEntity = parsedScene.areaLights[sh.lightIndex];

                    LightHandle area = LightHandle::CreateArea(
                        areaLightEntity.name, areaLightEntity.parameters,
                        *sh.renderFromObject, mi, s, &areaLightEntity.loc, Allocator{});
                    areaHandle = area;
                    if (area)
                        lights.push_back(area);
                }
                if (areaHandle == nullptr && !mi.IsMediumTransition() && !alphaTex)
                    primitives.push_back(new SimplePrimitive(s, mtl));
                else
                    primitives.push_back(
                        new GeometricPrimitive(s, mtl, areaHandle, mi, alphaTex));
            }
        }
        return primitives;
    };

    std::vector<PrimitiveHandle> primitives =
        CreatePrimitivesForShapes(parsedScene.shapes);

    // Animated shapes
    auto CreatePrimitivesForAnimatedShapes =
        [&](const std::vector<AnimatedShapeSceneEntity> &shapes)
        -> std::vector<PrimitiveHandle> {
        std::vector<PrimitiveHandle> primitives;
        primitives.reserve(shapes.size());

        for (const auto &sh : shapes) {
            pstd::vector<ShapeHandle> shapes =
                ShapeHandle::Create(sh.name, sh.identity, sh.identity,
                                    sh.reverseOrientation, sh.parameters, &sh.loc, alloc);
            if (shapes.empty())
                continue;

            FloatTextureHandle alphaTex = getAlphaTexture(sh.parameters, &sh.loc);
            sh.parameters.ReportUnused();  // do now so can grab alpha...

            // Create initial shape or shapes for animated shape

            MaterialHandle mtl = nullptr;
            if (!sh.materialName.empty()) {
                auto iter = namedMaterials.find(sh.materialName);
                if (iter == namedMaterials.end())
                    ErrorExit(&sh.loc, "%s: no named material defined.", sh.materialName);
                mtl = iter->second;
            } else {
                CHECK_LT(sh.materialIndex, materials.size());
                mtl = materials[sh.materialIndex];
            }

            MediumInterface mi(findMedium(sh.insideMedium, &sh.loc),
                               findMedium(sh.outsideMedium, &sh.loc));

            std::vector<PrimitiveHandle> prims;
            for (auto &s : shapes) {
                // Possibly create area light for shape
                LightHandle areaHandle = nullptr;
                if (sh.lightIndex != -1) {
                    CHECK_LT(sh.lightIndex, parsedScene.areaLights.size());
                    const auto &areaLightEntity = parsedScene.areaLights[sh.lightIndex];

                    if (sh.renderFromObject.IsAnimated())
                        Warning(&sh.loc, "Animated area lights aren't supported. Using "
                                         "the start transform.");

                    LightHandle area = LightHandle::CreateArea(
                        areaLightEntity.name, areaLightEntity.parameters,
                        sh.renderFromObject.startTransform, mi, s, &sh.loc, Allocator{});
                    areaHandle = area;
                    if (area)
                        lights.push_back(area);
                }
                if (areaHandle == nullptr && !mi.IsMediumTransition() && !alphaTex)
                    prims.push_back(new SimplePrimitive(s, mtl));
                else
                    prims.push_back(
                        new GeometricPrimitive(s, mtl, areaHandle, mi, alphaTex));
            }

            // TODO: could try to be greedy or even segment them according
            // to same sh.renderFromObject...

            // Create single _Primitive_ for _prims_
            if (prims.size() > 1) {
                PrimitiveHandle bvh = new BVHAggregate(std::move(prims));
                prims.clear();
                prims.push_back(bvh);
            }
            primitives.push_back(new AnimatedPrimitive(prims[0], sh.renderFromObject));
        }
        return primitives;
    };
    std::vector<PrimitiveHandle> animatedPrimitives =
        CreatePrimitivesForAnimatedShapes(parsedScene.animatedShapes);
    primitives.insert(primitives.end(), animatedPrimitives.begin(),
                      animatedPrimitives.end());

    // Instance definitions
    std::map<std::string, PrimitiveHandle> instanceDefinitions;
    for (const auto &inst : parsedScene.instanceDefinitions) {
        if (instanceDefinitions.find(inst.first) != instanceDefinitions.end())
            ErrorExit("%s: object instance redefined", inst.first);

        std::vector<PrimitiveHandle> instancePrimitives =
            CreatePrimitivesForShapes(inst.second.shapes);
        std::vector<PrimitiveHandle> movingInstancePrimitives =
            CreatePrimitivesForAnimatedShapes(inst.second.animatedShapes);
        instancePrimitives.insert(instancePrimitives.end(),
                                  movingInstancePrimitives.begin(),
                                  movingInstancePrimitives.end());
        if (instancePrimitives.empty()) {
            instanceDefinitions[inst.first] = nullptr;
        } else {
            if (instancePrimitives.size() > 1) {
                PrimitiveHandle bvh = new BVHAggregate(std::move(instancePrimitives));
                instancePrimitives.clear();
                instancePrimitives.push_back(bvh);
            }
            instanceDefinitions[inst.first] = instancePrimitives[0];
        }
    }

    // Instances
    for (const auto &inst : parsedScene.instances) {
        auto iter = instanceDefinitions.find(inst.name);
        if (iter == instanceDefinitions.end())
            ErrorExit(&inst.loc, "%s: object instance not defined", inst.name);

        if (iter->second == nullptr)
            // empty instance
            continue;

        if (inst.renderFromInstance)
            primitives.push_back(
                new TransformedPrimitive(iter->second, inst.renderFromInstance));
        else
            primitives.push_back(
                new AnimatedPrimitive(iter->second, inst.renderFromInstanceAnim));
    }

    // Accelerator
    PrimitiveHandle accel = nullptr;
    if (!primitives.empty())
        accel = CreateAccelerator(parsedScene.accelerator.name, std::move(primitives),
                                  parsedScene.accelerator.parameters);

    // Integrator
    const RGBColorSpace *integratorColorSpace = parsedScene.film.parameters.ColorSpace();
    std::unique_ptr<Integrator> integrator(Integrator::Create(
        parsedScene.integrator.name, parsedScene.integrator.parameters, camera, sampler,
        accel, lights, integratorColorSpace, &parsedScene.integrator.loc));

    // Helpful warnings
    if (haveScatteringMedia && parsedScene.integrator.name != "volpath" &&
        parsedScene.integrator.name != "simplevolpath" &&
        parsedScene.integrator.name != "bdpt" && parsedScene.integrator.name != "mlt")
        Warning("Scene has scattering media but \"%s\" integrator doesn't support "
                "volume scattering. Consider using \"volpath\", \"simplevolpath\", "
                "\"bdpt\", or \"mlt\".",
                parsedScene.integrator.name);

    bool haveLights = !lights.empty();
    for (const auto &m : media)
        haveLights |= m.second.IsEmissive();

    if (!haveLights && parsedScene.integrator.name != "ambientocclusion" &&
        parsedScene.integrator.name != "aov")
        Warning("No light sources defined in scene; rendering a black image.");

    if (parsedScene.film.name == "gbuffer" && parsedScene.integrator.name != "path")
        Warning(&parsedScene.film.loc,
                "GBufferFilm is not supported by %s. The channels "
                "other than R, G, B will be zero.",
                parsedScene.integrator.name);

    if (haveSubsurface && parsedScene.integrator.name != "volpath")
        Warning("Some objects in the scene have subsurface scattering, which is "
                "not supported by the %s integrator. Use the \"volpath\" integrator "
                "to render them correctly.",
                parsedScene.integrator.name);

    LOG_VERBOSE("Memory used after scene creation: %d", GetCurrentRSS());

    // Render!
    integrator->Render();

    LOG_VERBOSE("Memory used after rendering: %s", GetCurrentRSS());

    PtexTextureBase::ReportStats();
    ImageTextureBase::ClearCache();
    FreeBufferCaches();
}